

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb-emu.c
# Opt level: O2

int sdl2_handle_input(Input *i)

{
  int iVar1;
  SDL_Event event;
  
switchD_00101577_caseD_74:
  do {
    while( true ) {
      iVar1 = SDL_PollEvent(&event);
      if (iVar1 == 0) {
        return 0;
      }
      if (event.type != 0x200) break;
      if (event.display.event == '\x0e') {
LAB_00101586:
        i->type = Quit;
        return 1;
      }
    }
    if (event.type == 0x300) break;
    if (event.type == 0x301) {
      i->type = KeyUp;
      switch(event.window.data2) {
      case 0x73:
        goto switchD_00101577_caseD_73;
      case 0x74:
      case 0x75:
      case 0x76:
      case 0x79:
        goto switchD_00101577_caseD_74;
      case 0x77:
        goto switchD_00101577_caseD_77;
      case 0x78:
        goto switchD_00101577_caseD_78;
      case 0x7a:
        goto switchD_00101577_caseD_7a;
      default:
        goto switchD_00101577_default;
      }
    }
    if (event.type == 0x100) goto LAB_00101586;
  } while( true );
  i->type = KeyDown;
  switch(event.window.data2) {
  case 0x73:
switchD_00101577_caseD_73:
    i->button = Button_Down;
    return 1;
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x79:
    break;
  case 0x77:
switchD_00101577_caseD_77:
    i->button = Button_Up;
    return 1;
  case 0x78:
switchD_00101577_caseD_78:
    i->button = Button_B;
    return 1;
  case 0x7a:
switchD_00101577_caseD_7a:
    i->button = Button_A;
    return 1;
  default:
switchD_00101577_default:
    if (event.window.data2 == 8) {
      i->button = Button_Select;
      return 1;
    }
    if (event.window.data2 == 0xd) {
      i->button = Button_Start;
      return 1;
    }
    if (event.window.data2 == 0x61) {
      i->button = Button_Left;
      return 1;
    }
    if (event.window.data2 == 100) {
      i->button = Button_Right;
      return 1;
    }
  }
  goto switchD_00101577_caseD_74;
}

Assistant:

int
sdl2_handle_input(Input* i) {

    SDL_Event event;
    while (SDL_PollEvent(&event)) {
        switch (event.type) {
        
        case SDL_QUIT:
            i->type = Quit;
            return 1;
        
        case SDL_WINDOWEVENT:
            if(event.window.event == SDL_WINDOWEVENT_CLOSE) {
                i->type = Quit;
                return 1;
            }
            break;
        
        case SDL_KEYDOWN:
            i->type = KeyDown;
            switch(event.key.keysym.sym) {
                case SDLK_z:
                    i->button = Button_A;
                    return 1;
                case SDLK_x:
                    i->button = Button_B;
                    return 1;
                case SDLK_RETURN:
                    i->button = Button_Start;
                    return 1;
                case SDLK_BACKSPACE:
                    i->button = Button_Select;
                    return 1;
                case SDLK_w:
                    i->button = Button_Up;
                    return 1;
                case SDLK_s:
                    i->button = Button_Down;
                    return 1;
                case SDLK_d:
                    i->button = Button_Right;
                    return 1;
                case SDLK_a:
                    i->button = Button_Left;
                    return 1;
                default:
                    break;
            }
        break;

        case SDL_KEYUP:
            i->type = KeyUp;
            switch(event.key.keysym.sym) {
                case SDLK_z:
                    i->button = Button_A;
                    return 1;
                case SDLK_x:
                    i->button = Button_B;
                    return 1;
                case SDLK_RETURN:
                    i->button = Button_Start;
                    return 1;
                case SDLK_BACKSPACE:
                    i->button = Button_Select;
                    return 1;
                case SDLK_w:
                    i->button = Button_Up;
                    return 1;
                case SDLK_s:
                    i->button = Button_Down;
                    return 1;
                case SDLK_d:
                    i->button = Button_Right;
                    return 1;
                case SDLK_a:
                    i->button = Button_Left;
                    return 1;
                default:
                    break;
            }
        break;

        default:
            break;
        }
    }

    return 0;
}